

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioSop.c
# Opt level: O0

void Mio_SopPushSCC(Vec_Int_t *p,uint c)

{
  int iVar1;
  uint x;
  int local_20;
  int local_1c;
  int k;
  int i;
  uint Entry;
  uint c_local;
  Vec_Int_t *p_local;
  
  local_20 = 0;
  local_1c = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p);
    if (iVar1 <= local_1c) {
      Vec_IntShrink(p,local_20);
      Vec_IntPush(p,c);
      return;
    }
    x = Vec_IntEntry(p,local_1c);
    iVar1 = Mio_CubeContains(x,c);
    if (iVar1 != 0) break;
    iVar1 = Mio_CubeContains(c,x);
    if (iVar1 == 0) {
      Vec_IntWriteEntry(p,local_20,x);
      local_20 = local_20 + 1;
    }
    local_1c = local_1c + 1;
  }
  if (local_1c == local_20) {
    return;
  }
  __assert_fail("i == k",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/map/mio/mioSop.c"
                ,0x3c,"void Mio_SopPushSCC(Vec_Int_t *, unsigned int)");
}

Assistant:

void Mio_SopPushSCC( Vec_Int_t * p, unsigned c )
{
    unsigned Entry;
    int i, k = 0;
    Vec_IntForEachEntry( p, Entry, i )
    {
        if ( Mio_CubeContains( Entry, c ) ) // Entry contains c
        {
            assert( i == k );
            return;
        }
        if ( Mio_CubeContains( c, Entry ) ) // c contains Entry
            continue;
        Vec_IntWriteEntry( p, k++, Entry );
    }
    Vec_IntShrink( p, k );
    Vec_IntPush( p, c );
}